

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadCustom::ChLoadCustom(ChLoadCustom *this,shared_ptr<chrono::ChLoadable> *mloadable)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  int iVar3;
  
  ChObj::ChObj((ChObj *)this);
  (this->super_ChLoadBase).jacobians = (ChLoadJacobians *)0x0;
  (this->super_ChLoadBase).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLoadCustom_00b48b10;
  (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mloadable->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (mloadable->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  iVar3 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar3);
  lVar2 = (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (-1 < lVar2) {
    if (lVar2 != 0) {
      memset((this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data,0,lVar2 << 3);
      return;
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChLoadCustom::ChLoadCustom(std::shared_ptr<ChLoadable> mloadable) : loadable(mloadable) {
    load_Q.setZero(LoadGet_ndof_w());
}